

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void uavs3d_funs_init_intra_pred_c(void)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    uavs3d_funs_handle.intra_pred_ang[lVar1 + 3] = xPredIntraAngAdi_X;
    uavs3d_funs_handle.intra_pred_chroma_ang[lVar1 + 3] = xPredIntraAngAdiChroma_X;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    uavs3d_funs_handle.intra_pred_ang[lVar1 + 0xc] = xPredIntraAngAdi_XY;
    uavs3d_funs_handle.intra_pred_chroma_ang[lVar1 + 0xc] = xPredIntraAngAdiChroma_XY;
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    uavs3d_funs_handle.intra_pred_chroma_ang[lVar1 + -8] = xPredIntraAngAdi_Y;
    uavs3d_funs_handle.intra_pred_chroma_ang[lVar1 + 0x19] = xPredIntraAngAdiChroma_Y;
  }
  uavs3d_funs_handle.intra_pred_dc[0] = ipred_dc;
  uavs3d_funs_handle.intra_pred_bi[0] = ipred_bi;
  uavs3d_funs_handle.intra_pred_plane[0] = ipred_plane;
  uavs3d_funs_handle.intra_pred_hor[0] = ipred_hor;
  uavs3d_funs_handle.intra_pred_ver[0] = ipred_vert;
  uavs3d_funs_handle.intra_pred_dc[1] = ipred_dc_uv;
  uavs3d_funs_handle.intra_pred_bi[1] = ipred_bi_uv;
  uavs3d_funs_handle.intra_pred_plane[1] = ipred_plane_uv;
  uavs3d_funs_handle.intra_pred_hor[1] = ipred_hor_uv;
  uavs3d_funs_handle.intra_pred_ver[1] = ipred_vert;
  uavs3d_funs_handle.intra_pred_bi_ipf = ipred_bi_ipf;
  uavs3d_funs_handle.intra_pred_plane_ipf = ipred_plane_ipf;
  uavs3d_funs_handle.intra_pred_ang[4] = xPredIntraAngAdi_X_4;
  uavs3d_funs_handle.intra_pred_ang[6] = xPredIntraAngAdi_X_6;
  uavs3d_funs_handle.intra_pred_ang[8] = xPredIntraAngAdi_X_8;
  uavs3d_funs_handle.intra_pred_ang[10] = xPredIntraAngAdi_X_10;
  uavs3d_funs_handle.intra_pred_ang[0xd] = xPredIntraAngAdi_XY_13;
  uavs3d_funs_handle.intra_pred_ang[0xf] = xPredIntraAngAdi_XY_15;
  uavs3d_funs_handle.intra_pred_ang[0x11] = xPredIntraAngAdi_XY_17;
  uavs3d_funs_handle.intra_pred_ang[0x13] = xPredIntraAngAdi_XY_19;
  uavs3d_funs_handle.intra_pred_ang[0x15] = xPredIntraAngAdi_XY_21;
  uavs3d_funs_handle.intra_pred_ang[0x17] = xPredIntraAngAdi_XY_23;
  uavs3d_funs_handle.intra_pred_ang[0xe] = xPredIntraAngAdi_XY_14;
  uavs3d_funs_handle.intra_pred_ang[0x10] = xPredIntraAngAdi_XY_16;
  uavs3d_funs_handle.intra_pred_ang[0x12] = xPredIntraAngAdi_XY_18;
  uavs3d_funs_handle.intra_pred_ang[0x14] = xPredIntraAngAdi_XY_20;
  uavs3d_funs_handle.intra_pred_ang[0x16] = xPredIntraAngAdi_XY_22;
  uavs3d_funs_handle.intra_pred_ang[0x1a] = xPredIntraAngAdi_Y_26;
  uavs3d_funs_handle.intra_pred_ang[0x1c] = xPredIntraAngAdi_Y_28;
  uavs3d_funs_handle.intra_pred_ang[0x1e] = xPredIntraAngAdi_Y_30;
  uavs3d_funs_handle.intra_pred_ang[0x20] = xPredIntraAngAdi_Y_32;
  uavs3d_funs_handle.intra_pred_ipf = ipred_ipf_core;
  uavs3d_funs_handle.intra_pred_ipf_s16 = ipred_ipf_core_s16;
  return;
}

Assistant:

void uavs3d_funs_init_intra_pred_c()
{
    int i;

    for (i = IPD_BI + 1; i < IPD_VER; i++) {
        uavs3d_funs_handle.intra_pred_ang[i] = xPredIntraAngAdi_X;
        uavs3d_funs_handle.intra_pred_chroma_ang[i] = xPredIntraAngAdiChroma_X;
    }
    for (i = IPD_VER; i < IPD_HOR; i++) {
        uavs3d_funs_handle.intra_pred_ang[i] = xPredIntraAngAdi_XY;
        uavs3d_funs_handle.intra_pred_chroma_ang[i] = xPredIntraAngAdiChroma_XY;
    }
    for (i = IPD_HOR + 1; i < IPD_CNT; i++) {
        uavs3d_funs_handle.intra_pred_ang[i] = xPredIntraAngAdi_Y;
        uavs3d_funs_handle.intra_pred_chroma_ang[i] = xPredIntraAngAdiChroma_Y;
    }

    uavs3d_funs_handle.intra_pred_dc   [ Y_C] = ipred_dc;
    uavs3d_funs_handle.intra_pred_bi   [ Y_C] = ipred_bi;
    uavs3d_funs_handle.intra_pred_plane[ Y_C] = ipred_plane;
    uavs3d_funs_handle.intra_pred_hor  [ Y_C] = ipred_hor;
    uavs3d_funs_handle.intra_pred_ver  [ Y_C] = ipred_vert;
    uavs3d_funs_handle.intra_pred_dc   [UV_C] = ipred_dc_uv;
    uavs3d_funs_handle.intra_pred_bi   [UV_C] = ipred_bi_uv;
    uavs3d_funs_handle.intra_pred_plane[UV_C] = ipred_plane_uv;
    uavs3d_funs_handle.intra_pred_hor  [UV_C] = ipred_hor_uv;
    uavs3d_funs_handle.intra_pred_ver  [UV_C] = ipred_vert;
    uavs3d_funs_handle.intra_pred_bi_ipf      = ipred_bi_ipf;
    uavs3d_funs_handle.intra_pred_plane_ipf   = ipred_plane_ipf;

    uavs3d_funs_handle.intra_pred_ang[ 4] = xPredIntraAngAdi_X_4;
    uavs3d_funs_handle.intra_pred_ang[ 6] = xPredIntraAngAdi_X_6;
    uavs3d_funs_handle.intra_pred_ang[ 8] = xPredIntraAngAdi_X_8;
    uavs3d_funs_handle.intra_pred_ang[10] = xPredIntraAngAdi_X_10;

    uavs3d_funs_handle.intra_pred_ang[13] = xPredIntraAngAdi_XY_13;
    uavs3d_funs_handle.intra_pred_ang[15] = xPredIntraAngAdi_XY_15;
    uavs3d_funs_handle.intra_pred_ang[17] = xPredIntraAngAdi_XY_17;
    uavs3d_funs_handle.intra_pred_ang[19] = xPredIntraAngAdi_XY_19;
    uavs3d_funs_handle.intra_pred_ang[21] = xPredIntraAngAdi_XY_21;
    uavs3d_funs_handle.intra_pred_ang[23] = xPredIntraAngAdi_XY_23;

    uavs3d_funs_handle.intra_pred_ang[14] = xPredIntraAngAdi_XY_14;
    uavs3d_funs_handle.intra_pred_ang[16] = xPredIntraAngAdi_XY_16;
    uavs3d_funs_handle.intra_pred_ang[18] = xPredIntraAngAdi_XY_18;
    uavs3d_funs_handle.intra_pred_ang[20] = xPredIntraAngAdi_XY_20;
    uavs3d_funs_handle.intra_pred_ang[22] = xPredIntraAngAdi_XY_22;

    uavs3d_funs_handle.intra_pred_ang[26] = xPredIntraAngAdi_Y_26;
    uavs3d_funs_handle.intra_pred_ang[28] = xPredIntraAngAdi_Y_28;
    uavs3d_funs_handle.intra_pred_ang[30] = xPredIntraAngAdi_Y_30;
    uavs3d_funs_handle.intra_pred_ang[32] = xPredIntraAngAdi_Y_32;

    uavs3d_funs_handle.intra_pred_ipf     = ipred_ipf_core;
    uavs3d_funs_handle.intra_pred_ipf_s16 = ipred_ipf_core_s16;
}